

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateUnProtect(char *fedName,HelicsError *err)

{
  bool bVar1;
  size_t sVar2;
  FedObject *pFVar3;
  string_view fedName_00;
  string_view fedName_01;
  MasterObjectHolder *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  getMasterHolder();
  sVar2 = strlen(fedName);
  fedName_00._M_str = fedName;
  fedName_00._M_len = sVar2;
  bVar1 = MasterObjectHolder::removeFed(local_30,fedName_00,0x2352185);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (!bVar1) {
    getMasterHolder();
    sVar2 = strlen(fedName);
    fedName_01._M_str = fedName;
    fedName_01._M_len = sVar2;
    pFVar3 = MasterObjectHolder::findFed(local_30,fedName_01);
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (((err != (HelicsError *)0x0) && (pFVar3 == (FedObject *)0x0)) && (err->error_code == 0)) {
      err->error_code = -3;
      err->message = "Federate was not found";
    }
  }
  return;
}

Assistant:

void helicsFederateUnProtect(const char* fedName, HelicsError* err)
{
    const bool result = getMasterHolder()->removeFed(fedName, fedPreservationIdentifier);
    if (!result) {
        if (!(getMasterHolder()->findFed(fedName) != nullptr)) {
            if (err != nullptr) {
                if (err->error_code == 0) {
                    err->error_code = HELICS_ERROR_INVALID_OBJECT;
                    err->message = unrecognizedFederate;
                }
            }
        }
    }
}